

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::OptimizeAddedConstants::create(OptimizeAddedConstants *this)

{
  unique_ptr<wasm::OptimizeAddedConstants,_std::default_delete<wasm::OptimizeAddedConstants>_>
  local_20 [2];
  OptimizeAddedConstants *this_local;
  
  this_local = this;
  std::make_unique<wasm::OptimizeAddedConstants,bool&>((bool *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::OptimizeAddedConstants,std::default_delete<wasm::OptimizeAddedConstants>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::OptimizeAddedConstants,_std::default_delete<wasm::OptimizeAddedConstants>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<OptimizeAddedConstants>(propagate);
  }